

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

void __thiscall kratos::IRVisitor::visit_content(IRVisitor *this,Generator *generator)

{
  ulong uVar1;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  int iVar4;
  undefined4 extraout_var;
  __node_base_ptr p_Var5;
  _Base_ptr p_Var6;
  __hash_code __code;
  ulong uVar7;
  __node_base_ptr p_Var8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [8];
  pair<std::__detail::_Node_iterator<kratos::IRNode_*,_true,_false>,_bool> pVar12;
  undefined1 local_80 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  var_names;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
  functions;
  element_type *ptr;
  
  (*this->_vptr_IRVisitor[0x23])();
  this->level = this->level + 1;
  lVar10 = (long)(generator->stmts_).
                 super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(generator->stmts_).
                 super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if (lVar10 != 0) {
    lVar10 = lVar10 >> 4;
    lVar9 = 0;
    do {
      iVar4 = (*(generator->super_IRNode)._vptr_IRNode[2])(generator,lVar9);
      var_names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar4);
      uVar1 = (this->visited_)._M_h._M_bucket_count;
      uVar7 = (ulong)var_names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage % uVar1;
      p_Var2 = (this->visited_)._M_h._M_buckets[uVar7];
      p_Var5 = (__node_base_ptr)0x0;
      if ((p_Var2 != (__node_base_ptr)0x0) &&
         (p_Var5 = p_Var2, p_Var8 = p_Var2->_M_nxt,
         var_names.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)p_Var2->_M_nxt[1]._M_nxt)) {
        while (p_Var3 = p_Var8->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
          p_Var5 = (__node_base_ptr)0x0;
          if (((ulong)p_Var3[1]._M_nxt % uVar1 != uVar7) ||
             (p_Var5 = p_Var8, p_Var8 = p_Var3,
             var_names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)p_Var3[1]._M_nxt))
          goto LAB_001e0ec8;
        }
        p_Var5 = (__node_base_ptr)0x0;
      }
LAB_001e0ec8:
      if ((p_Var5 == (__node_base_ptr)0x0) || (p_Var5->_M_nxt == (_Hash_node_base *)0x0)) {
        pVar12 = std::
                 _Hashtable<kratos::IRNode*,kratos::IRNode*,std::allocator<kratos::IRNode*>,std::__detail::_Identity,std::equal_to<kratos::IRNode*>,std::hash<kratos::IRNode*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                 ::_M_emplace<kratos::IRNode*&>
                           ((_Hashtable<kratos::IRNode*,kratos::IRNode*,std::allocator<kratos::IRNode*>,std::__detail::_Identity,std::equal_to<kratos::IRNode*>,std::hash<kratos::IRNode*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                             *)&this->visited_,
                            &var_names.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        (**this->_vptr_IRVisitor)
                  (this,var_names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,pVar12._8_8_);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != lVar10 + (ulong)(lVar10 == 0));
  }
  Generator::get_all_var_names_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_80,generator);
  if (local_80 !=
      (undefined1  [8])
      var_names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    auVar11 = local_80;
    do {
      Generator::get_var((Generator *)
                         &var_names.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)generator);
      functions._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)var_names.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
      uVar1 = (this->visited_)._M_h._M_bucket_count;
      uVar7 = (ulong)var_names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage % uVar1;
      p_Var2 = (this->visited_)._M_h._M_buckets[uVar7];
      p_Var5 = (__node_base_ptr)0x0;
      if ((p_Var2 != (__node_base_ptr)0x0) &&
         (p_Var5 = p_Var2, p_Var8 = p_Var2->_M_nxt,
         var_names.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)p_Var2->_M_nxt[1]._M_nxt)) {
        while (p_Var3 = p_Var8->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
          p_Var5 = (__node_base_ptr)0x0;
          if (((ulong)p_Var3[1]._M_nxt % uVar1 != uVar7) ||
             (p_Var5 = p_Var8, p_Var8 = p_Var3,
             var_names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)p_Var3[1]._M_nxt))
          goto LAB_001e0f8d;
        }
        p_Var5 = (__node_base_ptr)0x0;
      }
LAB_001e0f8d:
      if ((p_Var5 == (__node_base_ptr)0x0) || (p_Var5->_M_nxt == (_Hash_node_base *)0x0)) {
        pVar12 = std::
                 _Hashtable<kratos::IRNode*,kratos::IRNode*,std::allocator<kratos::IRNode*>,std::__detail::_Identity,std::equal_to<kratos::IRNode*>,std::hash<kratos::IRNode*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                 ::_M_emplace<kratos::Var*&>
                           ((_Hashtable<kratos::IRNode*,kratos::IRNode*,std::allocator<kratos::IRNode*>,std::__detail::_Identity,std::equal_to<kratos::IRNode*>,std::hash<kratos::IRNode*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                             *)&this->visited_,
                            &functions._M_t._M_impl.super__Rb_tree_header._M_node_count);
        (*this->_vptr_IRVisitor[6])
                  (this,var_names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,pVar12._8_8_);
      }
      if (functions._M_t._M_impl._0_8_ != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)functions._M_t._M_impl._0_8_);
      }
      auVar11 = (undefined1  [8])((long)auVar11 + 0x20);
    } while (auVar11 !=
             (undefined1  [8])
             var_names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
              *)&var_names.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,&(generator->funcs_)._M_t);
  if (functions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
      (_Rb_tree_node_base *)&functions) {
    p_Var6 = functions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      functions._M_t._M_impl.super__Rb_tree_header._M_node_count = *(size_t *)(p_Var6 + 2);
      uVar1 = (this->visited_)._M_h._M_bucket_count;
      uVar7 = functions._M_t._M_impl.super__Rb_tree_header._M_node_count % uVar1;
      p_Var2 = (this->visited_)._M_h._M_buckets[uVar7];
      p_Var5 = (__node_base_ptr)0x0;
      if ((p_Var2 != (__node_base_ptr)0x0) &&
         (p_Var5 = p_Var2, p_Var8 = p_Var2->_M_nxt,
         (_Hash_node_base *)functions._M_t._M_impl.super__Rb_tree_header._M_node_count !=
         p_Var2->_M_nxt[1]._M_nxt)) {
        while (p_Var3 = p_Var8->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
          p_Var5 = (__node_base_ptr)0x0;
          if (((ulong)p_Var3[1]._M_nxt % uVar1 != uVar7) ||
             (p_Var5 = p_Var8, p_Var8 = p_Var3,
             (_Hash_node_base *)functions._M_t._M_impl.super__Rb_tree_header._M_node_count ==
             p_Var3[1]._M_nxt)) goto LAB_001e105a;
        }
        p_Var5 = (__node_base_ptr)0x0;
      }
LAB_001e105a:
      if ((p_Var5 == (__node_base_ptr)0x0) || (p_Var5->_M_nxt == (_Hash_node_base *)0x0)) {
        pVar12 = std::
                 _Hashtable<kratos::IRNode*,kratos::IRNode*,std::allocator<kratos::IRNode*>,std::__detail::_Identity,std::equal_to<kratos::IRNode*>,std::hash<kratos::IRNode*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                 ::_M_emplace<kratos::FunctionStmtBlock*&>
                           ((_Hashtable<kratos::IRNode*,kratos::IRNode*,std::allocator<kratos::IRNode*>,std::__detail::_Identity,std::equal_to<kratos::IRNode*>,std::hash<kratos::IRNode*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                             *)&this->visited_,
                            &functions._M_t._M_impl.super__Rb_tree_header._M_node_count);
        (**this->_vptr_IRVisitor)
                  (this,functions._M_t._M_impl.super__Rb_tree_header._M_node_count,pVar12._8_8_);
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != (_Rb_tree_node_base *)&functions);
  }
  this->level = this->level - 1;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
               *)&var_names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_80);
  return;
}

Assistant:

void IRVisitor::visit_content(Generator *generator) {
    generator->accept_generator(this);
    level++;
    uint64_t stmts_count = generator->stmts_count();
    for (uint64_t i = 0; i < stmts_count; i++) {
        auto *child = generator->get_child(i);
        if (visited_.find(child) == visited_.end()) {
            visited_.emplace(child);
            visit_root(child);
        }
    }
    // visit the vars
    auto var_names = generator->get_all_var_names();
    for (auto const &name : var_names) {
        auto var = generator->get_var(name);
        auto *ptr = var.get();
        if (visited_.find(ptr) == visited_.end()) {
            visited_.emplace(ptr);
            visit(var.get());
        }
    }
    // visit the functions
    // TODO: refactor this
    auto functions = generator->functions();
    for (auto const &iter : functions) {
        auto *ptr = iter.second.get();
        if (visited_.find(ptr) == visited_.end()) {
            visited_.emplace(ptr);
            visit_root(ptr);
        }
    }

    level--;
}